

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getVectorArraySum_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this,GLchar *array_name,
          GLuint columns,GLuint size)

{
  long lVar1;
  InitializerListTest *this_00;
  ulong uVar2;
  string name;
  size_t position;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  long local_68;
  char *local_60;
  string local_58;
  _func_int **local_38;
  
  local_70 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (columns != 0) {
    local_68 = (ulong)columns * 8;
    uVar2 = 1;
    lVar1 = 0;
    local_60 = array_name;
    do {
      local_38 = (_func_int **)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,local_60,(allocator<char> *)&local_90);
      this_00 = (InitializerListTest *)&stack0xffffffffffffffc8;
      Utils::replaceToken("INDEX",(size_t *)this_00,
                          *(GLchar **)((long)getVectorArraySum::lut + lVar1),&local_58);
      getVectorSum_abi_cxx11_(&local_90,this_00,local_58._M_dataplus._M_p,size);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (uVar2 < columns) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      lVar1 = lVar1 + 8;
      uVar2 = uVar2 + 1;
    } while (local_68 != lVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getVectorArraySum(const GLchar* array_name, GLuint columns, GLuint size)
{
	static const GLchar* lut[] = { "0", "1", "2", "3" };

	std::string sum;

	for (GLuint i = 0; i < columns; ++i)
	{
		size_t		position = 0;
		std::string name	 = array_name;

		Utils::replaceToken("INDEX", position, lut[i], name);

		sum.append(getVectorSum(name.c_str(), size));

		if (i + 1 < columns)
		{
			sum.append(" + ");
		}
	}

	return sum;
}